

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<int>::~RepeatedField(RepeatedField<int> *this)

{
  int *piVar1;
  void **ppvVar2;
  
  if (this->total_size_ == 0) {
    ppvVar2 = &this->arena_or_elements_;
  }
  else {
    piVar1 = elements(this);
    ppvVar2 = (void **)(piVar1 + -2);
  }
  if ((ThreadSafeArena *)*ppvVar2 != (ThreadSafeArena *)0x0) {
    internal::ThreadSafeArena::SpaceAllocated((ThreadSafeArena *)*ppvVar2);
  }
  if (0 < this->total_size_) {
    piVar1 = elements(this);
    if (*(long *)(piVar1 + -2) == 0) {
      operator_delete(piVar1 + -2);
      return;
    }
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
#ifndef NDEBUG
  // Try to trigger segfault / asan failure in non-opt builds. If arena_
  // lifetime has ended before the destructor.
  auto arena = GetArena();
  if (arena) (void)arena->SpaceAllocated();
#endif
  if (total_size_ > 0) {
    InternalDeallocate(rep(), total_size_);
  }
}